

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

char * __thiscall json::Value::parse(Value *this,char *curr,StringEncoding stringEncoding)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  char **__endptr;
  byte *pbVar10;
  byte *pbVar11;
  undefined1 auVar12 [16];
  undefined1 *local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  Value *local_58;
  Ref value;
  undefined1 local_40 [8];
  IString key;
  
  while( true ) {
    bVar1 = *curr;
    uVar3 = (uint)bVar1;
    if (0x5a < bVar1) break;
    if (0x22 < uVar3) goto LAB_00114575;
    if ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((ulong)uVar3 != 0x22) goto LAB_00114575;
      pbVar10 = (byte *)curr + 1;
      curr = (char *)pbVar10;
      goto LAB_001142a4;
    }
    curr = (char *)((byte *)curr + 1);
  }
  if (bVar1 < 0x6e) {
    if (bVar1 == 0x5b) {
      do {
        curr = (char *)((byte *)curr + 1);
        if (0x20 < (ulong)(byte)*curr) break;
      } while ((0x100002600U >> ((ulong)(byte)*curr & 0x3f) & 1) != 0);
      setArray(this,0);
LAB_0011445c:
      if (*curr != 0x5d) {
        local_40 = (undefined1  [8])operator_new(0x18);
        ((Value *)local_40)->type = Null;
        (((Value *)local_40)->field_1).str.str._M_len = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<json::Value*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&key,(Value *)local_40);
        std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>::push_back
                  ((this->field_1).arr,(value_type *)local_40);
        curr = parse((Value *)local_40,curr,stringEncoding);
        pbVar10 = (byte *)curr;
        while( true ) {
          pbVar10 = pbVar10 + 1;
          uVar7 = (ulong)(byte)*curr;
          if (0x2c < uVar7) break;
          if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
            if (uVar7 == 0x2c) goto LAB_001144ca;
            break;
          }
          curr = (char *)((byte *)curr + 1);
        }
        if (*curr != 0x5d) {
          psVar8 = (string *)__cxa_allocate_exception(0x20);
          local_158 = local_148;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,"malformed JSON array","");
          *(string **)psVar8 = psVar8 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar8,local_158,local_158 + local_150);
          __cxa_throw(psVar8,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
        }
        bVar2 = false;
        goto LAB_001144f3;
      }
      goto LAB_00114659;
    }
    if (bVar1 == 0x66) {
      pcVar9 = "false";
      iVar4 = strncmp(curr,"false",5);
      if (iVar4 == 0) {
        free(this,pcVar9);
        this->type = Bool;
        (this->field_1).boo = false;
        return (char *)((byte *)curr + 5);
      }
      psVar8 = (string *)__cxa_allocate_exception(0x20);
      local_f8 = local_e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"unexpected JSON literal","");
      *(string **)psVar8 = psVar8 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar8,local_f8,local_f8 + local_f0);
      __cxa_throw(psVar8,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
LAB_00114575:
    __endptr = (char **)local_40;
    value.super_shared_ptr<json::Value>.super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)strtod(curr,__endptr);
    free(this,__endptr);
    this->type = Number;
    (this->field_1).str.str._M_len =
         (size_t)value.super_shared_ptr<json::Value>.
                 super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    if (bVar1 == 0x6e) {
      pcVar9 = "null";
      iVar4 = strncmp(curr,"null",4);
      if (iVar4 != 0) {
        psVar8 = (string *)__cxa_allocate_exception(0x20);
        local_138 = local_128;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"unexpected JSON literal","");
        *(string **)psVar8 = psVar8 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar8,local_138,local_138 + local_130);
        __cxa_throw(psVar8,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
      }
      free(this,pcVar9);
      this->type = Null;
    }
    else {
      if (bVar1 != 0x74) {
        if (uVar3 == 0x7b) {
          do {
            curr = (char *)((byte *)curr + 1);
            if (0x20 < (ulong)(byte)*curr) break;
          } while ((0x100002600U >> ((ulong)(byte)*curr & 0x3f) & 1) != 0);
          value.super_shared_ptr<json::Value>.
          super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
               stringEncoding;
          setObject(this);
LAB_001142e1:
          if (*curr == 0x22) {
            pbVar11 = (byte *)curr + 1;
            pbVar10 = (byte *)strchr((char *)pbVar11,0x22);
            if (pbVar10 == (byte *)0x0) {
              psVar8 = (string *)__cxa_allocate_exception(0x20);
              local_b8 = local_a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,"malformed key in JSON object","");
              *(string **)psVar8 = psVar8 + 0x10;
              std::__cxx11::string::_M_construct<char*>(psVar8,local_b8,local_b8 + local_b0);
              __cxa_throw(psVar8,&JsonParseException::typeinfo,
                          JsonParseException::~JsonParseException);
            }
            *pbVar10 = 0;
            sVar5 = strlen((char *)pbVar11);
            auVar12 = wasm::IString::interned(sVar5,pbVar11,0);
            key.str._M_len = auVar12._8_8_;
            local_40 = auVar12._0_8_;
            pbVar11 = pbVar10 + 2;
            while( true ) {
              pbVar10 = pbVar10 + 1;
              uVar7 = (ulong)*pbVar10;
              if (0x3a < uVar7) goto LAB_00114671;
              if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
              pbVar11 = pbVar11 + 1;
            }
            if (uVar7 != 0x3a) {
LAB_00114671:
              psVar8 = (string *)__cxa_allocate_exception(0x20);
              local_98 = local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,"missing \':\', in JSON object","");
              *(string **)psVar8 = psVar8 + 0x10;
              std::__cxx11::string::_M_construct<char*>(psVar8,local_98,local_98 + local_90);
              __cxa_throw(psVar8,&JsonParseException::typeinfo,
                          JsonParseException::~JsonParseException);
            }
            while (((ulong)*pbVar11 < 0x21 && ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))
                  ) {
              pbVar11 = pbVar11 + 1;
            }
            local_58 = (Value *)operator_new(0x18);
            local_58->type = Null;
            (local_58->field_1).str.str._M_len = 0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<json::Value*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&value,local_58);
            curr = parse(local_58,(char *)pbVar11,
                         (StringEncoding)
                         value.super_shared_ptr<json::Value>.
                         super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            pmVar6 = std::__detail::
                     _Map_base<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)(this->field_1).arr,(key_type *)local_40);
            (pmVar6->super_shared_ptr<json::Value>).
            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(pmVar6->super_shared_ptr<json::Value>).
                        super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&value);
            pbVar10 = (byte *)curr;
            while( true ) {
              pbVar10 = pbVar10 + 1;
              uVar7 = (ulong)(byte)*curr;
              if (0x2c < uVar7) break;
              if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
                if (uVar7 == 0x2c) goto LAB_001143eb;
                break;
              }
              curr = (char *)((byte *)curr + 1);
            }
            if (*curr != 0x7d) {
              psVar8 = (string *)__cxa_allocate_exception(0x20);
              local_78 = local_68;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"malformed value in JSON object","");
              *(string **)psVar8 = psVar8 + 0x10;
              std::__cxx11::string::_M_construct<char*>(psVar8,local_78,local_78 + local_70);
              __cxa_throw(psVar8,&JsonParseException::typeinfo,
                          JsonParseException::~JsonParseException);
            }
            bVar2 = false;
            goto LAB_00114414;
          }
          if (*curr != 0x7d) {
            psVar8 = (string *)__cxa_allocate_exception(0x20);
            local_d8 = local_c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,"malformed key in JSON object","");
            *(string **)psVar8 = psVar8 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar8,local_d8,local_d8 + local_d0);
            __cxa_throw(psVar8,&JsonParseException::typeinfo,JsonParseException::~JsonParseException
                       );
          }
          goto LAB_00114659;
        }
        goto LAB_00114575;
      }
      pcVar9 = "true";
      iVar4 = strncmp(curr,"true",4);
      if (iVar4 != 0) {
        psVar8 = (string *)__cxa_allocate_exception(0x20);
        local_118 = local_108;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"unexpected JSON literal","");
        *(string **)psVar8 = psVar8 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar8,local_118,local_118 + local_110);
        __cxa_throw(psVar8,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
      }
      free(this,pcVar9);
      this->type = Bool;
      (this->field_1).boo = true;
    }
    local_40 = (undefined1  [8])((byte *)curr + 4);
  }
  return (char *)(Value *)local_40;
LAB_001144ca:
  while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))) {
    pbVar10 = pbVar10 + 1;
  }
  bVar2 = true;
  curr = (char *)pbVar10;
LAB_001144f3:
  if (key.str._M_len != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)key.str._M_len);
  }
  if (!bVar2) goto LAB_00114659;
  goto LAB_0011445c;
LAB_001143eb:
  while (((ulong)*pbVar10 < 0x21 && ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))) {
    pbVar10 = pbVar10 + 1;
  }
  bVar2 = true;
  curr = (char *)pbVar10;
LAB_00114414:
  if (value.super_shared_ptr<json::Value>.
      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               value.super_shared_ptr<json::Value>.
               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (!bVar2) goto LAB_00114659;
  goto LAB_001142e1;
LAB_001142a4:
  bVar1 = *curr;
  if (bVar1 == 0x5c) {
    if (((byte *)curr)[1] == 0) {
      psVar8 = (string *)__cxa_allocate_exception(0x20);
      local_178 = local_168;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,"unexpected end of JSON string (quoting)","");
      *(string **)psVar8 = psVar8 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar8,local_178,local_178 + local_170);
      __cxa_throw(psVar8,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
    curr = (char *)((byte *)curr + 1);
  }
  else if ((bVar1 == 0) || (bVar1 == 0x22)) {
    *curr = 0;
    if (stringEncoding == WTF16) {
      unescapeIntoWTF16(this,(char *)pbVar10);
    }
    else {
      if (stringEncoding != ASCII) {
        __assert_fail("stringEncoding == WTF16",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                      ,0x131,"char *json::Value::parse(char *, StringEncoding)");
      }
      setString(this,(char *)pbVar10);
    }
LAB_00114659:
    return (char *)((byte *)curr + 1);
  }
  curr = (char *)((byte *)curr + 1);
  goto LAB_001142a4;
}

Assistant:

char* parse(char* curr, StringEncoding stringEncoding) {
#define is_json_space(x)                                                       \
  (x == 32 || x == 9 || x == 10 ||                                             \
   x == 13) /* space, tab, linefeed/newline, or return */
#define skip()                                                                 \
  {                                                                            \
    while (*curr && is_json_space(*curr))                                      \
      curr++;                                                                  \
  }
    skip();
    if (*curr == '"') {
      // String
      // Start |close| after the opening ", and in the loop below we will always
      // begin looking at the first character after.
      char* close = curr + 1;
      // Skip escaped ", which appears as \". We need to be careful though, as
      // \" might also be \\" which would be an escaped \ and an *un*escaped ".
      while (*close && *close != '"') {
        if (*close == '\\') {
          // Skip the \ and the character after it, which it escapes.
          close++;
          THROW_IF(!*close, "unexpected end of JSON string (quoting)");
        }
        close++;
      }
      THROW_IF(!close, "unexpected end of JSON string");
      *close = 0; // end this string, and reuse it straight from the input
      char* raw = curr + 1;
      if (stringEncoding == ASCII) {
        // Just use the current string.
        setString(raw);
      } else {
        assert(stringEncoding == WTF16);
        unescapeIntoWTF16(raw);
      }
      curr = close + 1;
    } else if (*curr == '[') {
      // Array
      curr++;
      skip();
      setArray();
      while (*curr != ']') {
        Ref temp = Ref(new Value());
        arr->push_back(temp);
        curr = temp->parse(curr, stringEncoding);
        skip();
        if (*curr == ']') {
          break;
        }
        THROW_IF(*curr != ',', "malformed JSON array");
        curr++;
        skip();
      }
      curr++;
    } else if (*curr == 'n') {
      // Null
      THROW_IF(strncmp(curr, "null", 4) != 0, "unexpected JSON literal");
      setNull();
      curr += 4;
    } else if (*curr == 't') {
      // Bool true
      THROW_IF(strncmp(curr, "true", 4) != 0, "unexpected JSON literal");
      setBool(true);
      curr += 4;
    } else if (*curr == 'f') {
      // Bool false
      THROW_IF(strncmp(curr, "false", 5) != 0, "unexpected JSON literal");
      setBool(false);
      curr += 5;
    } else if (*curr == '{') {
      // Object
      curr++;
      skip();
      setObject();
      while (*curr != '}') {
        THROW_IF(*curr != '"', "malformed key in JSON object");
        curr++;
        char* close = strchr(curr, '"');
        THROW_IF(!close, "malformed key in JSON object");
        *close = 0; // end this string, and reuse it straight from the input
        IString key(curr);
        curr = close + 1;
        skip();
        THROW_IF(*curr != ':', "missing ':', in JSON object");
        curr++;
        skip();
        Ref value = Ref(new Value());
        curr = value->parse(curr, stringEncoding);
        (*obj)[key] = value;
        skip();
        if (*curr == '}') {
          break;
        }
        THROW_IF(*curr != ',', "malformed value in JSON object");
        curr++;
        skip();
      }
      curr++;
    } else {
      // Number
      char* after;
      setNumber(strtod(curr, &after));
      curr = after;
    }
    return curr;
  }